

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O1

int __thiscall NetOptimize::fuse_innerproduct_activation(NetOptimize *this)

{
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar1;
  Layer *pLVar2;
  int *piVar3;
  pointer ppLVar4;
  long *plVar5;
  undefined4 *puVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  string *psVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  Layer *pLVar15;
  Mat local_98;
  Layer *local_48;
  string *local_40;
  long local_38;
  
  pvVar1 = (this->super_ModelWriter).layers;
  lVar9 = (long)(pvVar1->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(pvVar1->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
  if (lVar9 != 0) {
    uVar10 = lVar9 >> 3;
    lVar9 = uVar10 + (uVar10 == 0);
    lVar12 = 0;
    local_38 = lVar9;
    do {
      iVar7 = std::__cxx11::string::compare
                        ((char *)&(((this->super_ModelWriter).layers)->
                                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)
                                  ._M_impl.super__Vector_impl_data._M_start[lVar12]->type);
      if (iVar7 == 0) {
        uVar13 = lVar12 + 1;
        uVar14 = uVar13;
        if (uVar13 < uVar10) {
          iVar7 = *((((this->super_ModelWriter).layers)->
                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar12]->tops).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start;
          do {
            iVar8 = std::__cxx11::string::compare
                              ((char *)&(((this->super_ModelWriter).layers)->
                                        super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                        )._M_impl.super__Vector_impl_data._M_start[uVar13]->type);
            if (((((iVar8 == 0) ||
                  (iVar8 = std::__cxx11::string::compare
                                     ((char *)&(((this->super_ModelWriter).layers)->
                                               super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                               )._M_impl.super__Vector_impl_data._M_start[uVar13]->
                                               type), iVar8 == 0)) ||
                 (iVar8 = std::__cxx11::string::compare
                                    ((char *)&(((this->super_ModelWriter).layers)->
                                              super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                              )._M_impl.super__Vector_impl_data._M_start[uVar13]->
                                              type), iVar8 == 0)) ||
                ((iVar8 = std::__cxx11::string::compare
                                    ((char *)&(((this->super_ModelWriter).layers)->
                                              super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                              )._M_impl.super__Vector_impl_data._M_start[uVar13]->
                                              type), iVar8 == 0 ||
                 (iVar8 = std::__cxx11::string::compare
                                    ((char *)&(((this->super_ModelWriter).layers)->
                                              super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                              )._M_impl.super__Vector_impl_data._M_start[uVar13]->
                                              type), iVar8 == 0)))) &&
               ((pLVar2 = (((this->super_ModelWriter).layers)->
                          super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                          .super__Vector_impl_data._M_start[uVar13],
                piVar3 = (pLVar2->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,
                (long)(pLVar2->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)piVar3 == 4 &&
                (lVar9 = local_38, uVar14 = uVar13, *piVar3 == iVar7)))) break;
            uVar13 = uVar13 + 1;
            lVar9 = local_38;
            uVar14 = uVar10;
          } while (uVar13 < uVar10);
        }
        if (uVar14 != uVar10) {
          ppLVar4 = (((this->super_ModelWriter).layers)->
                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          pLVar2 = ppLVar4[lVar12];
          pLVar15 = ppLVar4[uVar14];
          fprintf(_stderr,"fuse_innerproduct_activation %s %s\n",(pLVar2->name)._M_dataplus._M_p);
          local_40 = &pLVar15->type;
          iVar7 = std::__cxx11::string::compare((char *)local_40);
          psVar11 = local_40;
          if (iVar7 == 0) {
            if ((*(float *)&pLVar15[1]._vptr_Layer != 0.0) ||
               (NAN(*(float *)&pLVar15[1]._vptr_Layer))) {
              pLVar2[1].support_tensor_storage = true;
              pLVar2[1].support_reserved_00 = false;
              pLVar2[1].support_reserved_0 = false;
              pLVar2[1].support_reserved_1 = false;
              local_98.cstep = 0;
              local_98.data = (void *)0x0;
              local_98.refcount._0_4_ = 0;
              local_98.refcount._4_4_ = 0;
              local_98.elemsize._0_4_ = 0;
              local_98.elemsize._4_4_ = 0;
              local_98.elempack = 0;
              local_98.h = 0;
              local_98.d = 0;
              local_98.c = 0;
              local_98.allocator = (Allocator *)0x0;
              local_98.dims = 0;
              local_98.w = 0;
              local_48 = pLVar15;
              ncnn::Mat::create(&local_98,1,4,(Allocator *)0x0);
              if ((Mat *)&pLVar2[1].support_reserved_6 != &local_98) {
                piVar3 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
                if (piVar3 != (int *)0x0) {
                  LOCK();
                  *piVar3 = *piVar3 + 1;
                  UNLOCK();
                }
                piVar3 = (int *)pLVar2[1].userdata;
                if (piVar3 != (int *)0x0) {
                  LOCK();
                  *piVar3 = *piVar3 + -1;
                  UNLOCK();
                  if (*piVar3 == 0) {
                    plVar5 = (long *)pLVar2[1].type._M_string_length;
                    if (plVar5 == (long *)0x0) {
                      if (*(void **)&pLVar2[1].support_reserved_6 != (void *)0x0) {
                        free(*(void **)&pLVar2[1].support_reserved_6);
                      }
                    }
                    else {
                      (**(code **)(*plVar5 + 0x18))();
                    }
                  }
                }
                pLVar2[1].name._M_string_length = 0;
                *(undefined8 *)((long)&pLVar2[1].userdata + 4) = 0;
                *(undefined8 *)&pLVar2[1].field_0x2c = 0;
                pLVar2[1].support_reserved_6 = false;
                pLVar2[1].support_reserved_7 = false;
                pLVar2[1].support_reserved_8 = false;
                pLVar2[1].support_reserved_9 = false;
                pLVar2[1].featmask = 0;
                pLVar2[1].userdata = (void *)0x0;
                pLVar2[1].type.field_2._M_allocated_capacity = 0;
                *(undefined8 *)((long)&pLVar2[1].type.field_2 + 8) = 0;
                *(undefined4 *)&pLVar2[1].name._M_dataplus._M_p = 0;
                *(void **)&pLVar2[1].support_reserved_6 = local_98.data;
                pLVar2[1].userdata =
                     (void *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
                *(ulong *)&pLVar2[1].typeindex =
                     CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize);
                *(int *)&pLVar2[1].type._M_dataplus._M_p = local_98.elempack;
                pLVar2[1].type._M_string_length = (size_type)local_98.allocator;
                *(int *)&pLVar2[1].type.field_2 = local_98.dims;
                *(int *)((long)&pLVar2[1].type.field_2 + 4) = local_98.w;
                *(int *)((long)&pLVar2[1].type.field_2 + 8) = local_98.h;
                *(int *)((long)&pLVar2[1].type.field_2 + 0xc) = local_98.d;
                *(int *)&pLVar2[1].name._M_dataplus._M_p = local_98.c;
                pLVar2[1].name._M_string_length = local_98.cstep;
              }
              pLVar15 = local_48;
              piVar3 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
              if (piVar3 != (int *)0x0) {
                LOCK();
                *piVar3 = *piVar3 + -1;
                UNLOCK();
                if (*piVar3 == 0) {
                  if (local_98.allocator == (Allocator *)0x0) {
                    if (local_98.data != (void *)0x0) {
                      free(local_98.data);
                    }
                  }
                  else {
                    (*(local_98.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              **(undefined4 **)&pLVar2[1].support_reserved_6 =
                   *(undefined4 *)&pLVar15[1]._vptr_Layer;
              goto LAB_00137430;
            }
            pLVar2[1].support_tensor_storage = true;
            pLVar2[1].support_reserved_00 = false;
            pLVar2[1].support_reserved_0 = false;
            pLVar2[1].support_reserved_1 = false;
          }
          else {
            local_48 = pLVar15;
            iVar7 = std::__cxx11::string::compare((char *)local_40);
            if (iVar7 == 0) {
              pLVar2[1].support_tensor_storage = true;
              pLVar2[1].support_reserved_00 = false;
              pLVar2[1].support_reserved_0 = false;
              pLVar2[1].support_reserved_1 = false;
              local_98.cstep = 0;
              local_98.data = (void *)0x0;
              local_98.refcount._0_4_ = 0;
              local_98.refcount._4_4_ = 0;
              local_98.elemsize._0_4_ = 0;
              local_98.elemsize._4_4_ = 0;
              local_98.elempack = 0;
              local_98.h = 0;
              local_98.d = 0;
              local_98.c = 0;
              local_98.allocator = (Allocator *)0x0;
              local_98.dims = 0;
              local_98.w = 0;
              ncnn::Mat::create(&local_98,2,4,(Allocator *)0x0);
              pLVar15 = local_48;
              if ((Mat *)&pLVar2[1].support_reserved_6 != &local_98) {
                piVar3 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
                if (piVar3 != (int *)0x0) {
                  LOCK();
                  *piVar3 = *piVar3 + 1;
                  UNLOCK();
                }
                piVar3 = (int *)pLVar2[1].userdata;
                if (piVar3 != (int *)0x0) {
                  LOCK();
                  *piVar3 = *piVar3 + -1;
                  UNLOCK();
                  if (*piVar3 == 0) {
                    plVar5 = (long *)pLVar2[1].type._M_string_length;
                    if (plVar5 == (long *)0x0) {
                      if (*(void **)&pLVar2[1].support_reserved_6 != (void *)0x0) {
                        free(*(void **)&pLVar2[1].support_reserved_6);
                      }
                    }
                    else {
                      (**(code **)(*plVar5 + 0x18))();
                    }
                  }
                }
                pLVar2[1].name._M_string_length = 0;
                *(undefined8 *)((long)&pLVar2[1].userdata + 4) = 0;
                *(undefined8 *)&pLVar2[1].field_0x2c = 0;
                pLVar2[1].support_reserved_6 = false;
                pLVar2[1].support_reserved_7 = false;
                pLVar2[1].support_reserved_8 = false;
                pLVar2[1].support_reserved_9 = false;
                pLVar2[1].featmask = 0;
                pLVar2[1].userdata = (void *)0x0;
                pLVar2[1].type.field_2._M_allocated_capacity = 0;
                *(undefined8 *)((long)&pLVar2[1].type.field_2 + 8) = 0;
                *(undefined4 *)&pLVar2[1].name._M_dataplus._M_p = 0;
                *(void **)&pLVar2[1].support_reserved_6 = local_98.data;
                pLVar2[1].userdata =
                     (void *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
                *(ulong *)&pLVar2[1].typeindex =
                     CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize);
                *(int *)&pLVar2[1].type._M_dataplus._M_p = local_98.elempack;
                pLVar2[1].type._M_string_length = (size_type)local_98.allocator;
                *(int *)&pLVar2[1].type.field_2 = local_98.dims;
                *(int *)((long)&pLVar2[1].type.field_2 + 4) = local_98.w;
                *(int *)((long)&pLVar2[1].type.field_2 + 8) = local_98.h;
                *(int *)((long)&pLVar2[1].type.field_2 + 0xc) = local_98.d;
                *(int *)&pLVar2[1].name._M_dataplus._M_p = local_98.c;
                pLVar2[1].name._M_string_length = local_98.cstep;
              }
              piVar3 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
              if (piVar3 != (int *)0x0) {
                LOCK();
                *piVar3 = *piVar3 + -1;
                UNLOCK();
                if (*piVar3 == 0) {
                  if (local_98.allocator == (Allocator *)0x0) {
LAB_001373d1:
                    if (local_98.data != (void *)0x0) {
                      free(local_98.data);
                    }
                  }
                  else {
                    (*(local_98.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
LAB_001373ec:
              puVar6 = *(undefined4 **)&pLVar2[1].support_reserved_6;
              *puVar6 = *(undefined4 *)&pLVar15[1]._vptr_Layer;
              puVar6[1] = *(undefined4 *)((long)&pLVar15[1]._vptr_Layer + 4);
LAB_00137430:
              local_98.cstep = 0;
              local_98.c = 0;
              local_98.d = 0;
              local_98.h = 0;
              local_98.w = 0;
              local_98.dims = 0;
              local_98.elempack = 0;
              local_98.elemsize._4_4_ = 0;
              local_98.elemsize._0_4_ = 0;
              local_98.refcount._4_4_ = 0;
              local_98.refcount._0_4_ = 0;
              local_98.data = (void *)0x0;
              psVar11 = local_40;
            }
            else {
              iVar7 = std::__cxx11::string::compare((char *)psVar11);
              if (iVar7 == 0) {
                pLVar2[1].support_tensor_storage = true;
                pLVar2[1].support_reserved_00 = false;
                pLVar2[1].support_reserved_0 = false;
                pLVar2[1].support_reserved_1 = false;
                pLVar15 = local_48;
              }
              else {
                iVar7 = std::__cxx11::string::compare((char *)psVar11);
                if (iVar7 == 0) {
                  pLVar2[1].support_tensor_storage = true;
                  pLVar2[1].support_reserved_00 = false;
                  pLVar2[1].support_reserved_0 = false;
                  pLVar2[1].support_reserved_1 = false;
                  pLVar15 = local_48;
                }
                else {
                  iVar7 = std::__cxx11::string::compare((char *)psVar11);
                  pLVar15 = local_48;
                  if (iVar7 == 0) {
                    pLVar2[1].support_tensor_storage = true;
                    pLVar2[1].support_reserved_00 = false;
                    pLVar2[1].support_reserved_0 = false;
                    pLVar2[1].support_reserved_1 = false;
                    local_98.cstep = 0;
                    local_98.data = (void *)0x0;
                    local_98.refcount._0_4_ = 0;
                    local_98.refcount._4_4_ = 0;
                    local_98.elemsize._0_4_ = 0;
                    local_98.elemsize._4_4_ = 0;
                    local_98.elempack = 0;
                    local_98.h = 0;
                    local_98.d = 0;
                    local_98.c = 0;
                    local_98.allocator = (Allocator *)0x0;
                    local_98.dims = 0;
                    local_98.w = 0;
                    ncnn::Mat::create(&local_98,2,4,(Allocator *)0x0);
                    if ((Mat *)&pLVar2[1].support_reserved_6 != &local_98) {
                      piVar3 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
                      if (piVar3 != (int *)0x0) {
                        LOCK();
                        *piVar3 = *piVar3 + 1;
                        UNLOCK();
                      }
                      piVar3 = (int *)pLVar2[1].userdata;
                      if (piVar3 != (int *)0x0) {
                        LOCK();
                        *piVar3 = *piVar3 + -1;
                        UNLOCK();
                        if (*piVar3 == 0) {
                          plVar5 = (long *)pLVar2[1].type._M_string_length;
                          if (plVar5 == (long *)0x0) {
                            if (*(void **)&pLVar2[1].support_reserved_6 != (void *)0x0) {
                              free(*(void **)&pLVar2[1].support_reserved_6);
                            }
                          }
                          else {
                            (**(code **)(*plVar5 + 0x18))();
                          }
                        }
                      }
                      pLVar2[1].name._M_string_length = 0;
                      *(undefined8 *)((long)&pLVar2[1].userdata + 4) = 0;
                      *(undefined8 *)&pLVar2[1].field_0x2c = 0;
                      pLVar2[1].support_reserved_6 = false;
                      pLVar2[1].support_reserved_7 = false;
                      pLVar2[1].support_reserved_8 = false;
                      pLVar2[1].support_reserved_9 = false;
                      pLVar2[1].featmask = 0;
                      pLVar2[1].userdata = (void *)0x0;
                      pLVar2[1].type.field_2._M_allocated_capacity = 0;
                      *(undefined8 *)((long)&pLVar2[1].type.field_2 + 8) = 0;
                      *(undefined4 *)&pLVar2[1].name._M_dataplus._M_p = 0;
                      *(void **)&pLVar2[1].support_reserved_6 = local_98.data;
                      pLVar2[1].userdata =
                           (void *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
                      *(ulong *)&pLVar2[1].typeindex =
                           CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize);
                      *(int *)&pLVar2[1].type._M_dataplus._M_p = local_98.elempack;
                      pLVar2[1].type._M_string_length = (size_type)local_98.allocator;
                      *(int *)&pLVar2[1].type.field_2 = local_98.dims;
                      *(int *)((long)&pLVar2[1].type.field_2 + 4) = local_98.w;
                      *(int *)((long)&pLVar2[1].type.field_2 + 8) = local_98.h;
                      *(int *)((long)&pLVar2[1].type.field_2 + 0xc) = local_98.d;
                      *(int *)&pLVar2[1].name._M_dataplus._M_p = local_98.c;
                      pLVar2[1].name._M_string_length = local_98.cstep;
                    }
                    pLVar15 = local_48;
                    piVar3 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
                    if (piVar3 != (int *)0x0) {
                      LOCK();
                      *piVar3 = *piVar3 + -1;
                      UNLOCK();
                      if (*piVar3 == 0) {
                        if (local_98.allocator == (Allocator *)0x0) goto LAB_001373d1;
                        (*(local_98.allocator)->_vptr_Allocator[3])();
                      }
                    }
                    goto LAB_001373ec;
                  }
                }
              }
            }
          }
          iVar7 = *(pLVar15->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          *(pLVar2->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start = iVar7;
          (((this->super_ModelWriter).blobs)->
          super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
          super__Vector_impl_data._M_start[iVar7].producer = (int)lVar12;
          std::__cxx11::string::_M_replace
                    ((ulong)psVar11,0,(char *)(pLVar15->type)._M_string_length,0x5fd19a);
        }
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != lVar9);
  }
  return 0;
}

Assistant:

int NetOptimize::fuse_innerproduct_activation()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "InnerProduct")
            continue;

        // InnerProduct - Activation
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "ReLU" && layers[j]->type != "Clip" && layers[j]->type != "Sigmoid" && layers[j]->type != "Mish" && layers[j]->type != "HardSwish")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        // fuse InnerProduct - Activation to InnerProduct
        ncnn::InnerProduct* innerproduct = (ncnn::InnerProduct*)layers[i];
        ncnn::Layer* activation = layers[j];

        fprintf(stderr, "fuse_innerproduct_activation %s %s\n", innerproduct->name.c_str(), activation->name.c_str());

        if (activation->type == "ReLU")
        {
            ncnn::ReLU* relu = (ncnn::ReLU*)activation;

            if (relu->slope == 0.f)
            {
                innerproduct->activation_type = 1;
            }
            else
            {
                innerproduct->activation_type = 2;
                innerproduct->activation_params = ncnn::Mat(1);
                innerproduct->activation_params[0] = relu->slope;
            }
        }
        else if (activation->type == "Clip")
        {
            ncnn::Clip* clip = (ncnn::Clip*)activation;

            innerproduct->activation_type = 3;
            innerproduct->activation_params = ncnn::Mat(2);
            innerproduct->activation_params[0] = clip->min;
            innerproduct->activation_params[1] = clip->max;
        }
        else if (activation->type == "Sigmoid")
        {
            innerproduct->activation_type = 4;
        }
        else if (activation->type == "Mish")
        {
            innerproduct->activation_type = 5;
        }
        else if (activation->type == "HardSwish")
        {
            ncnn::HardSwish* hardswish = (ncnn::HardSwish*)activation;

            innerproduct->activation_type = 6;
            innerproduct->activation_params = ncnn::Mat(2);
            innerproduct->activation_params[0] = hardswish->alpha;
            innerproduct->activation_params[1] = hardswish->beta;
        }

        int top_blob_index_final = activation->tops[0];
        innerproduct->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = i;
        activation->type = "ncnnfused";
    }

    return 0;
}